

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall deqp::gles2::Functional::anon_unknown_2::DepthClearCase::test(DepthClearCase *this)

{
  float d;
  int local_38;
  GLfloat ref;
  int i;
  undefined1 local_24 [8];
  Random rnd;
  int numIterations;
  DepthClearCase *this_local;
  
  rnd.m_rnd.z = 0x78;
  unique0x1000019d = this;
  de::Random::Random((Random *)local_24,0xabcdef);
  (*this->m_verifier->_vptr_StateVerifier[3])
            (0x3f800000,this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb73);
  ApiCase::expectError(&this->super_ApiCase,0);
  for (local_38 = 0; local_38 < 0x78; local_38 = local_38 + 1) {
    d = de::Random::getFloat((Random *)local_24,0.0,1.0);
    glu::CallLogWrapper::glClearDepthf(&(this->super_ApiCase).super_CallLogWrapper,d);
    (*this->m_verifier->_vptr_StateVerifier[3])
              (d,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb73);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  de::Random::~Random((Random *)local_24);
  return;
}

Assistant:

void test (void)
	{
		const int numIterations = 120;

		de::Random rnd(0xabcdef);

		m_verifier->verifyFloatExpanded(m_testCtx, GL_DEPTH_CLEAR_VALUE, 1);
		expectError(GL_NO_ERROR);

		for (int i = 0; i < numIterations; ++i)
		{
			const GLfloat ref = rnd.getFloat(0, 1);

			glClearDepthf(ref);
			m_verifier->verifyFloatExpanded(m_testCtx, GL_DEPTH_CLEAR_VALUE, ref);
			expectError(GL_NO_ERROR);
		}
	}